

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  long lVar4;
  long local_68;
  int *piStack_60;
  undefined8 local_58;
  long *plStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar4 = 0;
  do {
    *(undefined4 *)((long)&this->params[0].loaded + lVar4) = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    plStack_50 = (long *)0x0;
    local_68 = 0;
    piStack_60 = (int *)0x0;
    local_38 = 0;
    if ((long *)((long)&this->params[0].v.data + lVar4) != &local_68) {
      piVar1 = *(int **)((long)&this->params[0].v.refcount + lVar4);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          lVar2 = *(long *)((long)&this->params[0].v.data + lVar4);
          plVar3 = *(long **)((long)&this->params[0].v.allocator + lVar4);
          if (plVar3 == (long *)0x0) {
            if (lVar2 != 0) {
              free(*(void **)(lVar2 + -8));
            }
          }
          else {
            (**(code **)(*plVar3 + 8))();
          }
        }
      }
      plVar3 = (long *)((long)&this->params[0].v.data + lVar4);
      *plVar3 = 0;
      *(undefined8 *)((long)&this->params[0].v.refcount + lVar4) = 0;
      *(undefined8 *)((long)&this->params[0].v.elemsize + lVar4) = 0;
      *(undefined8 *)((long)&this->params[0].v.cstep + lVar4) = 0;
      *(undefined8 *)((long)&this->params[0].v.dims + lVar4) = 0;
      *(undefined8 *)((long)&this->params[0].v.h + lVar4) = 0;
      *plVar3 = local_68;
      *(int **)((long)&this->params[0].v.refcount + lVar4) = piStack_60;
      *(undefined8 *)((long)&this->params[0].v.elemsize + lVar4) = local_58;
      *(long **)((long)&this->params[0].v.allocator + lVar4) = plStack_50;
      *(undefined8 *)((long)&this->params[0].v.dims + lVar4) = local_48;
      *(undefined8 *)((long)&this->params[0].v.h + lVar4) = uStack_40;
      *(undefined8 *)((long)&this->params[0].v.cstep + lVar4) = local_38;
    }
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + -1;
      UNLOCK();
      if (*piStack_60 == 0) {
        if (plStack_50 == (long *)0x0) {
          if (local_68 != 0) {
            free(*(void **)(local_68 + -8));
          }
        }
        else {
          (**(code **)(*plStack_50 + 8))();
        }
      }
    }
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x500);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].loaded = 0;
        params[i].v = Mat();
    }
}